

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.c
# Opt level: O1

Mig_Man_t * Mig_ManStart(void)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  Mig_Man_t *pMVar4;
  int *piVar5;
  undefined8 *__s;
  void **ppvVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  
  pMVar4 = (Mig_Man_t *)calloc(1,0xb0);
  if ((pMVar4->vCis).nCap < 0x400) {
    piVar5 = (pMVar4->vCis).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc(0x1000);
    }
    else {
      piVar5 = (int *)realloc(piVar5,0x1000);
    }
    (pMVar4->vCis).pArray = piVar5;
    if (piVar5 == (int *)0x0) goto LAB_0047eb95;
    (pMVar4->vCis).nCap = 0x400;
  }
  if ((pMVar4->vCos).nCap < 0x400) {
    piVar5 = (pMVar4->vCos).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc(0x1000);
    }
    else {
      piVar5 = (int *)realloc(piVar5,0x1000);
    }
    (pMVar4->vCos).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
LAB_0047eb95:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pMVar4->vCos).nCap = 0x400;
  }
  iVar9 = pMVar4->nObjs;
  if (iVar9 == 0x7fffffff) {
    __assert_fail("p->nObjs < MIG_NONE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                  ,0xdc,"Mig_Obj_t *Mig_ManAppendObj(Mig_Man_t *)");
  }
  uVar1 = (pMVar4->vPages).nSize;
  iVar7 = uVar1 * 0x1000;
  if (iVar9 < iVar7) goto LAB_0047eb39;
  if (iVar9 != iVar7) {
    __assert_fail("p->nObjs == (Vec_PtrSize(&p->vPages) << MIG_BASE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                  ,0xe0,"Mig_Obj_t *Mig_ManAppendObj(Mig_Man_t *)");
  }
  __s = (undefined8 *)malloc(0x10020);
  memset(__s,0xff,0x10020);
  *__s = pMVar4;
  uVar2 = (pMVar4->vPages).nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      ppvVar6 = (pMVar4->vPages).pArray;
      if (ppvVar6 == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(ppvVar6,0x80);
      }
      (pMVar4->vPages).pArray = ppvVar6;
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar2 * 2;
      if (iVar9 <= (int)uVar2) goto LAB_0047eb27;
      ppvVar6 = (pMVar4->vPages).pArray;
      if (ppvVar6 == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(ppvVar6,(ulong)uVar2 << 4);
      }
      (pMVar4->vPages).pArray = ppvVar6;
    }
    (pMVar4->vPages).nCap = iVar9;
  }
LAB_0047eb27:
  iVar9 = (pMVar4->vPages).nSize;
  (pMVar4->vPages).nSize = iVar9 + 1;
  (pMVar4->vPages).pArray[iVar9] = __s + 2;
LAB_0047eb39:
  uVar1 = pMVar4->nObjs;
  pMVar4->nObjs = uVar1 + 1;
  if ((int)uVar1 < 0) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                  ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
  }
  if ((int)(uVar1 >> 0xc) < (pMVar4->vPages).nSize) {
    pvVar3 = (pMVar4->vPages).pArray[uVar1 >> 0xc];
    uVar8 = (ulong)((uVar1 & 0xfff) << 4);
    uVar2 = *(uint *)((long)pvVar3 + uVar8 + 0xc);
    if (0xfffffffd < uVar2) {
      *(uint *)((long)pvVar3 + uVar8 + 0xc) = (uVar2 & 1) + uVar1 * 2;
      return pMVar4;
    }
    __assert_fail("Mig_ObjIsNone(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                  ,0xea,"Mig_Obj_t *Mig_ManAppendObj(Mig_Man_t *)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Mig_Man_t * Mig_ManStart()
{
    Mig_Man_t * p;
    assert( sizeof(Mig_Obj_t) >= 16 );
    assert( (1 << MIG_BASE) == MIG_MASK + 1 );
    p = ABC_CALLOC( Mig_Man_t, 1 );
    Vec_IntGrow( &p->vCis, 1024 );
    Vec_IntGrow( &p->vCos, 1024 );
    Mig_ManAppendObj( p ); // const0
    return p;
}